

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psa_crypto.c
# Opt level: O3

psa_status_t psa_mac_update(psa_mac_operation_t *operation,uint8_t *input,size_t input_length)

{
  byte bVar1;
  int iVar2;
  
  bVar1 = operation->field_0x4;
  iVar2 = -0x89;
  if ((bVar1 & 6) != 2 && (bVar1 & 1) != 0) {
    operation->field_0x4 = bVar1 | 8;
    if (operation->alg == 0x2c00002) {
      iVar2 = mbedtls_cipher_cmac_update(&(operation->ctx).cmac,input,input_length);
      iVar2 = mbedtls_to_psa_error(iVar2);
    }
    else {
      if ((operation->alg & 0x7fc00000) != 0x2800000) {
        return -0x89;
      }
      iVar2 = psa_hash_update(&(operation->ctx).hmac.hash_ctx,input,input_length);
    }
    if (iVar2 == 0) {
      iVar2 = 0;
    }
    else {
      psa_mac_abort(operation);
    }
  }
  return iVar2;
}

Assistant:

psa_status_t psa_mac_update( psa_mac_operation_t *operation,
                             const uint8_t *input,
                             size_t input_length )
{
    psa_status_t status = PSA_ERROR_BAD_STATE;
    if( ! operation->key_set )
        return( PSA_ERROR_BAD_STATE );
    if( operation->iv_required && ! operation->iv_set )
        return( PSA_ERROR_BAD_STATE );
    operation->has_input = 1;

#if defined(MBEDTLS_CMAC_C)
    if( operation->alg == PSA_ALG_CMAC )
    {
        int ret = mbedtls_cipher_cmac_update( &operation->ctx.cmac,
                                              input, input_length );
        status = mbedtls_to_psa_error( ret );
    }
    else
#endif /* MBEDTLS_CMAC_C */
#if defined(MBEDTLS_MD_C)
    if( PSA_ALG_IS_HMAC( operation->alg ) )
    {
        status = psa_hash_update( &operation->ctx.hmac.hash_ctx, input,
                                  input_length );
    }
    else
#endif /* MBEDTLS_MD_C */
    {
        /* This shouldn't happen if `operation` was initialized by
         * a setup function. */
        return( PSA_ERROR_BAD_STATE );
    }

    if( status != PSA_SUCCESS )
        psa_mac_abort( operation );
    return( status );
}